

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [16];
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiID IVar5;
  ImGuiItemStatusFlags IVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  bool bVar9;
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  ImVec2 local_c8;
  ImVec2 local_c0;
  undefined1 local_b8 [16];
  ImDrawList *local_a8;
  ImVec2 local_a0;
  ImVec2 label_size;
  ImVec2 frame_padding_local;
  float local_88;
  ImVec2 unsaved_marker_pos;
  float local_58;
  undefined1 extraout_var [56];
  
  pIVar7 = GImGui;
  auVar12._8_56_ = in_register_00001208;
  auVar12._0_8_ = frame_padding;
  local_b8 = auVar12._0_16_;
  frame_padding_local = (ImVec2)vmovlps_avx(local_b8);
  local_a8 = draw_list;
  auVar13._0_8_ = CalcTextSize(label,(char *)0x0,true,-1.0);
  auVar13._8_56_ = extraout_var;
  label_size = (ImVec2)vmovlps_avx(auVar13._0_16_);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar14 = (bb->Min).x;
  fVar16 = (bb->Max).x;
  if (1.0 < fVar16 - fVar14) {
    auVar11 = vinsertps_avx(ZEXT416((uint)fVar14),ZEXT416((uint)(bb->Min).y),0x10);
    auVar15._0_4_ = auVar11._0_4_ + local_b8._0_4_;
    auVar15._4_4_ = auVar11._4_4_ + local_b8._4_4_;
    auVar15._8_4_ = auVar11._8_4_ + local_b8._8_4_;
    auVar15._12_4_ = auVar11._12_4_ + local_b8._12_4_;
    fVar16 = fVar16 - local_b8._0_4_;
    fVar14 = (bb->Max).y;
    local_88 = auVar13._0_4_;
    if ((flags & 1U) != 0) {
      auVar11 = vmovshdup_avx(local_b8);
      IVar10 = CalcTextSize("*",(char *)0x0,false,-1.0);
      fVar16 = fVar16 - IVar10.x;
      local_58 = auVar11._0_4_;
      auVar2 = vminss_avx(ZEXT416((uint)(local_b8._0_4_ + (bb->Min).x + local_88 + 2.0)),
                          ZEXT416((uint)fVar16));
      auVar11 = vcvtdq2ps_avx(ZEXT416((uint)(int)(pIVar7->FontSize * -0.25)));
      unsaved_marker_pos.y = local_58 + (bb->Min).y + auVar11._0_4_;
      unsaved_marker_pos.x = auVar2._0_4_;
      auVar11._8_8_ = 0;
      auVar11._0_4_ = (bb->Max).x;
      auVar11._4_4_ = (bb->Max).y;
      auVar11 = vsubps_avx(auVar11,local_b8);
      local_c8 = (ImVec2)vmovlps_avx(auVar11);
      local_a0.x = 0.0;
      local_a0.y = 0.0;
      RenderTextClippedEx(local_a8,&unsaved_marker_pos,&local_c8,"*",(char *)0x0,(ImVec2 *)0x0,
                          &local_a0,(ImRect *)0x0);
    }
    local_c8 = (ImVec2)vmovlps_avx(auVar15);
    if (out_text_clipped != (bool *)0x0) {
      *out_text_clipped = fVar16 < auVar15._0_4_ + local_88;
    }
    local_c0.x = fVar16;
    local_c0.y = fVar14;
    if (((close_button_id == 0) ||
        ((!is_contents_visible &&
         ((bb->Max).x - (bb->Min).x < (pIVar7->Style).TabMinWidthForCloseButton)))) ||
       ((pIVar7->HoveredId != close_button_id && pIVar7->HoveredId != tab_id &&
        (pIVar7->ActiveId != tab_id && pIVar7->ActiveId != close_button_id)))) {
      fVar14 = (bb->Max).x + -1.0;
      bVar8 = false;
    }
    else {
      pIVar1 = GImGui->CurrentWindow;
      unsaved_marker_pos = (pIVar1->DC).LastItemRect.Min;
      IVar10 = (pIVar1->DC).LastItemRect.Max;
      IVar3 = (pIVar1->DC).LastItemDisplayRect.Min;
      IVar4 = (pIVar1->DC).LastItemDisplayRect.Max;
      local_b8._0_4_ = pIVar7->FontSize;
      IVar5 = (pIVar1->DC).LastItemId;
      IVar6 = (pIVar1->DC).LastItemStatusFlags;
      PushStyleVar(10,&frame_padding_local);
      local_a0.y = (bb->Min).y;
      local_a0.x = ((bb->Max).x - (frame_padding_local.x + frame_padding_local.x)) -
                   (float)local_b8._0_4_;
      bVar8 = CloseButton(close_button_id,&local_a0);
      PopStyleVar(1);
      pIVar1 = GImGui->CurrentWindow;
      (pIVar1->DC).LastItemId = IVar5;
      (pIVar1->DC).LastItemStatusFlags = IVar6;
      (pIVar1->DC).LastItemRect.Min = unsaved_marker_pos;
      (pIVar1->DC).LastItemRect.Max = IVar10;
      (pIVar1->DC).LastItemDisplayRect.Min = IVar3;
      (pIVar1->DC).LastItemDisplayRect.Max = IVar4;
      if ((flags & 4U) == 0) {
        bVar9 = IsMouseClicked(2,false);
        if (bVar9) {
          bVar8 = true;
        }
      }
      fVar16 = fVar16 - (float)local_b8._0_4_;
      fVar14 = fVar16;
    }
    RenderTextEllipsis(local_a8,&local_c8,&local_c0,fVar16,fVar14,label,(char *)0x0,&label_size);
    if (out_just_closed != (bool *)0x0) {
      *out_just_closed = bVar8;
    }
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= g.Style.TabMinWidthForCloseButton)
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiLastItemDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}